

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

bool wabt::anon_unknown_1::IsCommand(TokenTypePair pair)

{
  byte bVar1;
  
  if (pair._M_elems[1] < Result && pair._M_elems[0] == Lpar) {
    bVar1 = (byte)(0x1022400fc >> ((byte)pair._M_elems[1] & 0x3f));
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool IsCommand(TokenTypePair pair) {
  if (pair[0] != TokenType::Lpar) {
    return false;
  }

  switch (pair[1]) {
    case TokenType::AssertExhaustion:
    case TokenType::AssertInvalid:
    case TokenType::AssertMalformed:
    case TokenType::AssertReturn:
    case TokenType::AssertTrap:
    case TokenType::AssertUnlinkable:
    case TokenType::Get:
    case TokenType::Invoke:
    case TokenType::Module:
    case TokenType::Register:
      return true;
    default:
      return false;
  }
}